

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O1

bool duckdb::SortTdoms(RelationsToTDom *a,RelationsToTDom *b)

{
  long lVar1;
  idx_t *piVar2;
  
  if (a->has_tdom_hll == true) {
    if (b->has_tdom_hll == true) {
      piVar2 = &a->tdom_hll;
      lVar1 = 0x38;
    }
    else {
      piVar2 = &a->tdom_hll;
      lVar1 = 0x40;
    }
  }
  else {
    piVar2 = &a->tdom_no_hll;
    lVar1 = (ulong)(b->has_tdom_hll ^ 1) * 8 + 0x38;
  }
  return *(ulong *)((long)&(b->equivalent_relations)._M_h._M_buckets + lVar1) < *piVar2;
}

Assistant:

bool SortTdoms(const RelationsToTDom &a, const RelationsToTDom &b) {
	if (a.has_tdom_hll && b.has_tdom_hll) {
		return a.tdom_hll > b.tdom_hll;
	}
	if (a.has_tdom_hll) {
		return a.tdom_hll > b.tdom_no_hll;
	}
	if (b.has_tdom_hll) {
		return a.tdom_no_hll > b.tdom_hll;
	}
	return a.tdom_no_hll > b.tdom_no_hll;
}